

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

void __thiscall wasm::Wasm2JSBuilder::addMemoryFuncs(Wasm2JSBuilder *this,Ref ast,Module *wasm)

{
  Value *this_00;
  pointer puVar1;
  Memory *pMVar2;
  size_t sVar3;
  char *pcVar4;
  Ref ast_00;
  Ref *pRVar5;
  Value *pVVar6;
  Ref this_01;
  Ref RVar7;
  char *in_RCX;
  undefined1 *puVar8;
  Ref in_R8;
  IString name;
  string_view sVar9;
  IString key;
  IString op;
  Ref local_48;
  Ref memorySizeFunc;
  
  name.str._M_str = (char *)wasm;
  name.str._M_len = DAT_00da8780;
  memorySizeFunc = ast;
  local_48 = cashew::ValueBuilder::makeFunction(WASM_MEMORY_SIZE,name);
  pRVar5 = cashew::Ref::operator[](&local_48,3);
  pcVar4 = DAT_00da85f0;
  sVar3 = BUFFER;
  this_00 = pRVar5->inst;
  puVar8 = &DAT_00000018;
  pVVar6 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar6->type = Null;
  cashew::Value::free(pVVar6,puVar8);
  pVVar6->type = String;
  (pVVar6->field_1).str.str._M_len = sVar3;
  (pVVar6->field_1).str.str._M_str = pcVar4;
  sVar9 = IString::interned((IString *)0xa,(string_view)ZEXT816(0xb3d63d),SUB81(in_RCX,0));
  key.str._M_len = sVar9._M_str;
  key.str._M_str = in_RCX;
  this_01 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar6,(Value *)sVar9._M_len,key);
  sVar3 = DAT_00da8cd0;
  RVar7.inst = cashew::DIV.inst;
  puVar8 = &DAT_00000018;
  pVVar6 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar6->type = Null;
  cashew::Value::free(pVVar6,puVar8);
  ast_00 = memorySizeFunc;
  pVVar6->type = Number;
  (pVVar6->field_1).arr = (ArrayStorage *)0x40f0000000000000;
  op.str._M_str = (char *)pVVar6;
  op.str._M_len = sVar3;
  RVar7 = cashew::ValueBuilder::makeBinary(this_01.inst,RVar7,op,in_R8);
  RVar7 = makeJsCoercion(RVar7,JS_INT);
  RVar7 = cashew::ValueBuilder::makeReturn(RVar7);
  cashew::Value::push_back(this_00,RVar7);
  RVar7 = ast_00;
  cashew::Value::push_back(ast_00.inst,local_48);
  puVar1 = (wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((puVar1 != (wasm->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
     (pMVar2 = (puVar1->_M_t).
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
               super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl,
     (pMVar2->initial).addr < (pMVar2->max).addr)) {
    addMemoryGrowFunc((Wasm2JSBuilder *)RVar7.inst,ast_00,wasm);
  }
  return;
}

Assistant:

void Wasm2JSBuilder::addMemoryFuncs(Ref ast, Module* wasm) {
  Ref memorySizeFunc = ValueBuilder::makeFunction(WASM_MEMORY_SIZE);
  memorySizeFunc[3]->push_back(ValueBuilder::makeReturn(
    makeJsCoercion(ValueBuilder::makeBinary(
                     ValueBuilder::makeDot(ValueBuilder::makeName(BUFFER),
                                           IString("byteLength")),
                     DIV,
                     ValueBuilder::makeInt(Memory::kPageSize)),
                   JsType::JS_INT)));
  ast->push_back(memorySizeFunc);

  if (!wasm->memories.empty() &&
      wasm->memories[0]->max > wasm->memories[0]->initial) {
    addMemoryGrowFunc(ast, wasm);
  }
}